

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O2

void __thiscall tri_cc_geom_t::clear(tri_cc_geom_t *this)

{
  boost::shared_ptr<tri_cc_t>::reset(&this->m_tri_cc);
  if (*(long *)&this->field_0x18 != *(long *)&this->m_cell_pos) {
    *(long *)&this->field_0x18 = *(long *)&this->m_cell_pos;
  }
  if (*(long *)&this->field_0x30 != *(long *)&this->m_cell_normal) {
    *(long *)&this->field_0x30 = *(long *)&this->m_cell_normal;
  }
  return;
}

Assistant:

void tri_cc_geom_t::clear()
{
  m_tri_cc.reset();

  m_cell_pos.clear();

  m_cell_normal.clear();
}